

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O3

Transform * phyr::Transform::rotateX(Transform *__return_storage_ptr__,double theta)

{
  bool bVar1;
  bool bVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  dVar3 = cos(theta * 0.017453292519943295);
  dVar4 = sin(theta * 0.017453292519943295);
  bVar1 = NAN(theta);
  bVar2 = theta == 0.0;
  if ((bVar2) && (!bVar1)) {
    dVar3 = 1.0;
  }
  dVar5 = -dVar4;
  if ((bVar2) && (!bVar1)) {
    dVar4 = 0.0;
  }
  if ((bVar2) && (!bVar1)) {
    dVar5 = 0.0;
  }
  (__return_storage_ptr__->mat).d[0][0] = 1.0;
  (__return_storage_ptr__->mat).d[0][1] = 0.0;
  (__return_storage_ptr__->mat).d[0][2] = 0.0;
  (__return_storage_ptr__->mat).d[0][3] = 0.0;
  (__return_storage_ptr__->mat).d[1][0] = 0.0;
  (__return_storage_ptr__->mat).d[1][1] = dVar3;
  (__return_storage_ptr__->mat).d[1][2] = dVar5;
  (__return_storage_ptr__->mat).d[1][3] = 0.0;
  (__return_storage_ptr__->mat).d[2][0] = 0.0;
  (__return_storage_ptr__->mat).d[2][1] = dVar4;
  (__return_storage_ptr__->mat).d[2][2] = dVar3;
  (__return_storage_ptr__->mat).d[2][3] = 0.0;
  (__return_storage_ptr__->mat).d[3][0] = 0.0;
  (__return_storage_ptr__->mat).d[3][1] = 0.0;
  (__return_storage_ptr__->mat).d[3][2] = 0.0;
  (__return_storage_ptr__->mat).d[3][3] = 1.0;
  (__return_storage_ptr__->invMat).d[0][0] = 1.0;
  (__return_storage_ptr__->invMat).d[0][1] = 0.0;
  (__return_storage_ptr__->invMat).d[0][2] = 0.0;
  (__return_storage_ptr__->invMat).d[0][3] = 0.0;
  (__return_storage_ptr__->invMat).d[1][0] = 0.0;
  (__return_storage_ptr__->invMat).d[1][1] = dVar3;
  (__return_storage_ptr__->invMat).d[1][2] = dVar4;
  (__return_storage_ptr__->invMat).d[1][3] = 0.0;
  (__return_storage_ptr__->invMat).d[2][0] = 0.0;
  (__return_storage_ptr__->invMat).d[2][1] = dVar5;
  (__return_storage_ptr__->invMat).d[2][2] = dVar3;
  (__return_storage_ptr__->invMat).d[3][1] = 0.0;
  (__return_storage_ptr__->invMat).d[3][2] = 0.0;
  (__return_storage_ptr__->invMat).d[2][3] = 0.0;
  (__return_storage_ptr__->invMat).d[3][0] = 0.0;
  (__return_storage_ptr__->invMat).d[3][3] = 1.0;
  return __return_storage_ptr__;
}

Assistant:

Transform Transform::rotateX(Real theta) {
    Mat4x4 m;
    Real cosTheta = std::cos(radians(theta));
    Real sinTheta = std::sin(radians(theta));

    if (theta == 0.0)
        m = Mat4x4(); // Identity
    else {
        m = Mat4x4(1,        0,          0, 0,
                   0,  cosTheta, -sinTheta, 0,
                   0,  sinTheta,  cosTheta, 0,
                   0,        0,          0, 1);
    }

    return Transform(m, Mat4x4::transpose(m));
}